

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::SingleArena_CopyConstructSSO_Test::TestBody
          (SingleArena_CopyConstructSSO_Test *this)

{
  bool bVar1;
  pointer arena_00;
  string *lhs;
  char *message;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  ArenaStringPtr dst;
  ArenaStringPtr field;
  undefined1 local_38 [8];
  unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> arena;
  string empty;
  SingleArena_CopyConstructSSO_Test *this_local;
  
  std::__cxx11::string::string((string *)&arena);
  SingleArena::GetArena((SingleArena *)local_38);
  internal::ArenaStringPtr::InitExternal(&dst,(string *)&arena);
  internal::ArenaStringPtr::Set(&dst,"Hello world",(Arena *)0x0);
  arena_00 = std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
             ::get((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
                    *)local_38);
  internal::ArenaStringPtr::ArenaStringPtr((ArenaStringPtr *)&gtest_ar.message_,arena_00,&dst);
  lhs = internal::ArenaStringPtr::Get_abi_cxx11_((ArenaStringPtr *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[12],_nullptr>
            ((EqHelper *)local_68,"dst.Get()","\"Hello world\"",lhs,(char (*) [12])"Hello world");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0xbd,message);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  bVar1 = std::operator==((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
                           *)local_38,(nullptr_t)0x0);
  if (bVar1) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&gtest_ar.message_);
  }
  internal::ArenaStringPtr::Destroy(&dst);
  std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
  ~unique_ptr((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> *)
              local_38);
  std::__cxx11::string::~string((string *)&arena);
  return;
}

Assistant:

TEST_P(SingleArena, CopyConstructSSO) {
  std::string empty;
  auto arena = GetArena();
  ArenaStringPtr field;
  field.InitExternal(&empty);
  field.Set("Hello world", nullptr);

  ArenaStringPtr dst(arena.get(), field);
  EXPECT_EQ(dst.Get(), "Hello world");
  if (arena == nullptr) dst.Destroy();
  field.Destroy();
}